

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O2

int Sfm_ObjRef(Sfm_Ntk_t *p,int iObj)

{
  int iVar1;
  int Count;
  int iVar2;
  int i;
  int k;
  
  iVar2 = 1;
  k = 0;
  while( true ) {
    iVar1 = Sfm_ObjFaninNum(p,iObj);
    if (iVar1 <= k) break;
    iVar1 = Sfm_ObjFanin(p,iObj,k);
    iVar1 = Sfm_ObjRef_rec(p,iVar1);
    iVar2 = iVar2 + iVar1;
    k = k + 1;
  }
  return iVar2;
}

Assistant:

int Sfm_ObjRef( Sfm_Ntk_t * p, int iObj )
{
    int i, iFanin, Count = 1;
    Sfm_ObjForEachFanin( p, iObj, iFanin, i )
        Count += Sfm_ObjRef_rec( p, iFanin );
    return Count;
}